

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c <= *(short *)(in_RDI + 0x70); local_c = local_c + 1) {
    releasePage((MemPage *)0x135ed9);
    *(undefined8 *)(in_RDI + 0xa0 + (long)local_c * 8) = 0;
  }
  *(undefined2 *)(in_RDI + 0x70) = 0xffff;
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  for(i=0; i<=pCur->iPage; i++){
    releasePage(pCur->apPage[i]);
    pCur->apPage[i] = 0;
  }
  pCur->iPage = -1;
}